

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O0

void spot_free(Spot *spot)

{
  void *in_RDI;
  uchar i;
  undefined1 local_9;
  
  for (local_9 = 0; local_9 < *(byte *)((long)in_RDI + 2); local_9 = local_9 + 1) {
    card_free((Card *)0x109727);
  }
  free(*(void **)((long)in_RDI + 8));
  free(in_RDI);
  return;
}

Assistant:

void spot_free(Spot * spot)
{
	unsigned char i;
	for(i=0;i<spot->cardsCount;i++)
	{
		card_free(spot->cards[i]);
	}
	free(spot->cards);
	free(spot);
}